

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManEvaluateMappingEdge(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  int local_34;
  int DelayMax;
  int i;
  Vec_Int_t *vArray;
  abctime clk;
  int DelayGlo_local;
  Sbl_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  Vec_IntClear(p->vPath);
  Sbl_ManGetCurrentMapping(p);
  iVar1 = Gia_ManEvalWindow(p->pGia,p->vLeaves,p->vAnds,p->vWindow,p->vPolar,1);
  aVar3 = Abc_Clock();
  p->timeTime = (aVar3 - aVar2) + p->timeTime;
  if (DelayGlo < iVar1) {
    for (local_34 = 0; iVar1 = Vec_WecSize(p->vWindow), local_34 < iVar1; local_34 = local_34 + 1) {
      pVVar4 = Vec_WecEntry(p->vWindow,local_34);
      iVar1 = Vec_IntSize(pVVar4);
      if (0 < iVar1) {
        pVVar4 = p->vPath;
        iVar1 = Abc_Var2Lit(local_34,1);
        Vec_IntPush(pVVar4,iVar1);
      }
    }
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Sbl_ManEvaluateMappingEdge( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vArray; 
    int i, DelayMax;
    Vec_IntClear( p->vPath );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    // derive new timing
    DelayMax = Gia_ManEvalWindow( p->pGia, p->vLeaves, p->vAnds, p->vWindow, p->vPolar, 1 );
    p->timeTime += Abc_Clock() - clk;
    if ( DelayMax <= DelayGlo )
        return 1;
    // create critical path composed of all nodes
    Vec_WecForEachLevel( p->vWindow, vArray, i )
        if ( Vec_IntSize(vArray) > 0 )
            Vec_IntPush( p->vPath, Abc_Var2Lit(i, 1) );
    return 0;
}